

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O2

void resp0_ctx_close(void *arg)

{
  nni_mtx *mtx;
  nni_aio *pnVar1;
  long lVar2;
  
  mtx = *arg;
  nni_mtx_lock(mtx);
  pnVar1 = *(nni_aio **)((long)arg + 0x18);
  if (pnVar1 != (nni_aio *)0x0) {
    lVar2 = *(long *)((long)arg + 0x10);
    *(undefined8 *)((long)arg + 0x10) = 0;
    *(undefined8 *)((long)arg + 0x18) = 0;
    nni_list_remove((nni_list *)(lVar2 + 0x18),arg);
    nni_aio_finish_error(pnVar1,NNG_ECLOSED);
  }
  pnVar1 = *(nni_aio **)((long)arg + 0x20);
  if (pnVar1 != (nni_aio *)0x0) {
    *(undefined8 *)((long)arg + 0x20) = 0;
    nni_list_remove((nni_list *)&mtx[6].mtx.__data.__list.__next,arg);
    nni_aio_finish_error(pnVar1,NNG_ECLOSED);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
resp0_ctx_close(void *arg)
{
	resp0_ctx  *ctx = arg;
	resp0_sock *s   = ctx->sock;
	nni_aio    *aio;

	// complete any outstanding operations here, cancellation, etc.

	nni_mtx_lock(&s->mtx);
	if ((aio = ctx->saio) != NULL) {
		resp0_pipe *p = ctx->spipe;
		ctx->saio     = NULL;
		ctx->spipe    = NULL;
		nni_list_remove(&p->sendq, ctx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	if ((aio = ctx->raio) != NULL) {
		ctx->raio = NULL;
		nni_list_remove(&s->recvq, ctx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	nni_mtx_unlock(&s->mtx);
}